

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

partSizeData *
initAndReadDeepScanLine
          (vector<int,_std::allocator<int>_> *sampleCount,
          vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          *sampleData,
          vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
          *pixelPtrs,DeepFrameBuffer *buf,DeepScanLineInputPart *in,
          vector<int,_std::allocator<int>_> *inputSampleCount,Header *outHeader,
          vector<double,_std::allocator<double>_> *countPerf,
          vector<double,_std::allocator<double>_> *samplePerf)

{
  PixelType PVar1;
  time_point end;
  time_point end_00;
  time_point start;
  time_point start_00;
  Slice *pSVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  DeepSlice *pDVar6;
  char **ppcVar7;
  reference piVar8;
  Channel *pCVar9;
  char *pcVar10;
  reference this;
  reference ppcVar11;
  const_reference pvVar12;
  string *psVar13;
  Compression *pCVar14;
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  *in_RCX;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  partSizeData *in_RDI;
  Slice *in_R8;
  DeepFrameBuffer *in_R9;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  time_point endSampleRead;
  time_point startSampleRead;
  uint64_t p;
  int offset;
  int samplesize_1;
  ConstIterator i_2;
  int i_1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  size_t totalSamples;
  time_point endCountRead;
  time_point startCountRead;
  vector<int,_std::allocator<int>_> *samples;
  int samplesize;
  ConstIterator i;
  int bytesPerSample;
  int channelNumber;
  uint64_t offsetToOrigin;
  int numChans;
  uint64_t numPixels;
  uint64_t height;
  uint64_t width;
  Box2i dw;
  partSizeData *data;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 uVar15;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 uVar16;
  undefined4 in_stack_fffffffffffffdc4;
  undefined4 uVar17;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  size_type in_stack_fffffffffffffdd8;
  partSizeData *in_stack_fffffffffffffde0;
  vector<int,_std::allocator<int>_> *local_1e8;
  size_type local_170;
  int local_168;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_140;
  vector<int,_std::allocator<int>_> *local_138;
  long local_130;
  undefined8 local_128;
  undefined8 local_120;
  double local_118;
  undefined8 local_110;
  undefined8 local_108;
  vector<int,_std::allocator<int>_> *local_100;
  DeepSlice local_f8 [60];
  int local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  int local_a8;
  int local_a4;
  Slice local_a0 [56];
  long local_68;
  int local_5c;
  uint64_t local_58;
  long local_50;
  long local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  DeepFrameBuffer *local_30;
  Slice *local_28;
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  *local_20;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *local_18;
  vector<int,_std::allocator<int>_> *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Imf_3_4::DeepScanLineInputPart::header();
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  local_48 = (long)((local_38 + 1) - local_40);
  local_50 = (long)((local_34 + 1) - local_3c);
  local_58 = local_48 * local_50;
  Imf_3_4::DeepScanLineInputPart::header();
  local_5c = channelCount((Header *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
             in_stack_fffffffffffffdd8);
  local_68 = local_48 * local_3c + (long)local_40;
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::resize((vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
            *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  pSVar2 = local_28;
  piVar5 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x114738);
  uVar15 = 1;
  uVar16 = 0;
  uVar17 = 0;
  Imf_3_4::Slice::Slice
            (local_a0,UINT,(char *)(piVar5 + -local_68),4,local_48 << 2,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice(pSVar2);
  local_a4 = 0;
  local_a8 = 0;
  Imf_3_4::Header::channels();
  local_b0 = Imf_3_4::ChannelList::begin();
  while( true ) {
    Imf_3_4::Header::channels();
    local_b8 = Imf_3_4::ChannelList::end();
    bVar3 = Imf_3_4::operator!=((ConstIterator *)CONCAT44(in_stack_fffffffffffffdc4,uVar16),
                                (ConstIterator *)CONCAT44(in_stack_fffffffffffffdbc,uVar15));
    if (!bVar3) break;
    std::
    vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
    ::operator[](local_20,(long)local_a4);
    std::vector<char_*,_std::allocator<char_*>_>::resize
              ((vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffffde0,
               in_stack_fffffffffffffdd8);
    pCVar9 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x114841);
    local_bc = Imf_3_4::pixelTypeSize(*(PixelType *)pCVar9);
    pSVar2 = local_28;
    pDVar6 = (DeepSlice *)Imf_3_4::ChannelList::ConstIterator::name((ConstIterator *)0x114869);
    pCVar9 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x11487b);
    PVar1 = *(PixelType *)pCVar9;
    std::
    vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
    ::operator[](local_20,(long)local_a4);
    ppcVar7 = std::vector<char_*,_std::allocator<char_*>_>::data
                        ((vector<char_*,_std::allocator<char_*>_> *)0x11489e);
    uVar15 = 1;
    uVar16 = 1;
    uVar17 = 0;
    in_stack_fffffffffffffdd0 = 0;
    Imf_3_4::DeepSlice::DeepSlice
              (local_f8,PVar1,(char *)(ppcVar7 + -local_68),8,local_48 << 3,(long)local_bc,1,1,0.0,
               false,false);
    Imf_3_4::DeepFrameBuffer::insert((char *)pSVar2,pDVar6);
    local_a4 = local_a4 + 1;
    local_a8 = local_bc + local_a8;
    Imf_3_4::ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffdc4,uVar16));
  }
  if (in_stack_00000008 == (vector<int,_std::allocator<int>_> *)0x0) {
    local_1e8 = local_10;
  }
  else {
    local_1e8 = in_stack_00000008;
  }
  local_100 = local_1e8;
  if (in_stack_00000008 == (vector<int,_std::allocator<int>_> *)0x0) {
    Imf_3_4::DeepScanLineInputPart::setFrameBuffer(local_30);
    local_108 = std::chrono::_V2::steady_clock::now();
    Imf_3_4::DeepScanLineInputPart::readPixelSampleCounts((int)local_30,local_3c);
    local_128 = std::chrono::_V2::steady_clock::now();
    local_120 = local_108;
    start.__d.__r._4_4_ = in_stack_fffffffffffffdd4;
    start.__d.__r._0_4_ = in_stack_fffffffffffffdd0;
    end.__d.__r._4_4_ = in_stack_fffffffffffffdcc;
    end.__d.__r._0_4_ = uVar17;
    local_110 = local_128;
    local_118 = timing(start,end);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffffdc4,uVar16)
               ,(value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffdbc,uVar15));
  }
  local_130 = 0;
  local_138 = local_100;
  local_140._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffdbc,uVar15));
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_fffffffffffffdbc,uVar15));
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)CONCAT44(in_stack_fffffffffffffdc4,uVar16),
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)CONCAT44(in_stack_fffffffffffffdbc,uVar15)), bVar3) {
    piVar8 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_140);
    local_130 = *piVar8 + local_130;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_140);
  }
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::resize((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  local_a4 = 0;
  Imf_3_4::DeepScanLineInputPart::header();
  Imf_3_4::Header::channels();
  Imf_3_4::ChannelList::begin();
  while( true ) {
    Imf_3_4::DeepScanLineInputPart::header();
    Imf_3_4::Header::channels();
    Imf_3_4::ChannelList::end();
    bVar3 = Imf_3_4::operator!=((ConstIterator *)CONCAT44(in_stack_fffffffffffffdc4,uVar16),
                                (ConstIterator *)CONCAT44(in_stack_fffffffffffffdbc,uVar15));
    if (!bVar3) break;
    pCVar9 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x114b6c);
    iVar4 = Imf_3_4::pixelTypeSize(*(PixelType *)pCVar9);
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::operator[](local_18,(long)local_a4);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffde0,
               in_stack_fffffffffffffdd8);
    local_168 = 0;
    for (local_170 = 0; local_170 < local_58; local_170 = local_170 + 1) {
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::operator[](local_18,(long)local_a4);
      pcVar10 = std::vector<char,_std::allocator<char>_>::data
                          ((vector<char,_std::allocator<char>_> *)0x114bf2);
      this = std::
             vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
             ::operator[](local_20,(long)local_a4);
      ppcVar11 = std::vector<char_*,_std::allocator<char_*>_>::operator[](this,local_170);
      *ppcVar11 = pcVar10 + local_168 * iVar4;
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](local_100,local_170);
      local_168 = *pvVar12 + local_168;
    }
    local_a4 = local_a4 + 1;
    Imf_3_4::ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffdc4,uVar16));
  }
  if (in_stack_00000008 == (vector<int,_std::allocator<int>_> *)0x0) {
    std::chrono::_V2::steady_clock::now();
    Imf_3_4::DeepScanLineInputPart::readPixels((int)local_30,local_3c);
    std::chrono::_V2::steady_clock::now();
    start_00.__d.__r._4_4_ = in_stack_fffffffffffffdd4;
    start_00.__d.__r._0_4_ = in_stack_fffffffffffffdd0;
    end_00.__d.__r._4_4_ = in_stack_fffffffffffffdcc;
    end_00.__d.__r._0_4_ = uVar17;
    timing(start_00,end_00);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffffdc4,uVar16)
               ,(value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffdbc,uVar15));
  }
  partSizeData::partSizeData(in_stack_fffffffffffffde0);
  in_RDI->pixelCount = local_58;
  in_RDI->rawSize = local_130 * local_a8 + local_58 * 4;
  in_RDI->isDeep = true;
  Imf_3_4::DeepScanLineInputPart::header();
  psVar13 = (string *)Imf_3_4::Header::type_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&in_RDI->partType,psVar13);
  Imf_3_4::DeepScanLineInputPart::header();
  pCVar14 = (Compression *)Imf_3_4::Header::compression();
  in_RDI->compression = *pCVar14;
  in_RDI->channelCount = (long)local_5c;
  return in_RDI;
}

Assistant:

partSizeData
initAndReadDeepScanLine (
    vector<int>&           sampleCount,
    vector<vector<char>>&  sampleData,
    vector<vector<char*>>& pixelPtrs,
    DeepFrameBuffer&       buf,
    DeepScanLineInputPart& in,
    const vector<int>*     inputSampleCount,
    const Header&          outHeader,
    vector<double>&        countPerf,
    vector<double>&        samplePerf)
{
    Box2i    dw        = in.header ().dataWindow ();
    uint64_t width     = dw.max.x + 1 - dw.min.x;
    uint64_t height    = dw.max.y + 1 - dw.min.y;
    uint64_t numPixels = width * height;
    int      numChans  = channelCount (in.header ());
    sampleCount.resize (numPixels);

    uint64_t offsetToOrigin = width * static_cast<uint64_t> (dw.min.y) +
                              static_cast<uint64_t> (dw.min.x);

    pixelPtrs.resize (numChans);

    buf.insertSampleCountSlice (Slice (
        UINT,
        (char*) (sampleCount.data () - offsetToOrigin),
        sizeof (int),
        sizeof (int) * width));
    int channelNumber  = 0;
    int bytesPerSample = 0;
    for (ChannelList::ConstIterator i = outHeader.channels ().begin ();
         i != outHeader.channels ().end ();
         ++i)
    {
        pixelPtrs[channelNumber].resize (numPixels);
        int samplesize = pixelTypeSize (i.channel ().type);
        buf.insert (
            i.name (),
            DeepSlice (
                i.channel ().type,
                (char*) (pixelPtrs[channelNumber].data () - offsetToOrigin),
                sizeof (char*),
                sizeof (char*) * width,
                samplesize));
        ++channelNumber;
        bytesPerSample += samplesize;
    }

    const vector<int>& samples = inputSampleCount ? *inputSampleCount
                                                  : sampleCount;
    if (!inputSampleCount)
    {
        in.setFrameBuffer (buf);

        steady_clock::time_point startCountRead = steady_clock::now ();
        in.readPixelSampleCounts (dw.min.y, dw.max.y);
        steady_clock::time_point endCountRead = steady_clock::now ();

        countPerf.push_back (timing (startCountRead, endCountRead));
    }

    size_t totalSamples = 0;

    for (int i: samples)
    {
        totalSamples += i;
    }

    sampleData.resize (numChans);
    channelNumber = 0;
    for (ChannelList::ConstIterator i = in.header ().channels ().begin ();
         i != in.header ().channels ().end ();
         ++i)
    {
        int samplesize = pixelTypeSize (i.channel ().type);
        sampleData[channelNumber].resize (samplesize * totalSamples);
        int offset = 0;
        for (uint64_t p = 0; p < numPixels; ++p)
        {
            pixelPtrs[channelNumber][p] =
                sampleData[channelNumber].data () + offset * samplesize;
            offset += samples[p];
        }

        ++channelNumber;
    }

    if (!inputSampleCount)
    {

        steady_clock::time_point startSampleRead = steady_clock::now ();
        in.readPixels (dw.min.y, dw.max.y);
        steady_clock::time_point endSampleRead = steady_clock::now ();
        samplePerf.push_back (timing (startSampleRead, endSampleRead));
    }

    partSizeData data;
    data.pixelCount = numPixels;

    //raw size includes the sample count table
    data.rawSize     = totalSamples * bytesPerSample + numPixels * sizeof (int);
    data.isDeep      = true;
    data.partType    = in.header ().type ();
    data.compression = in.header ().compression ();
    data.channelCount = numChans;

    return data;
}